

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.h
# Opt level: O2

ByteData * __thiscall
cfd::core::ByteData::Concat<cfd::core::ByteData160,cfd::core::ByteData256>
          (ByteData *__return_storage_ptr__,ByteData *this,ByteData160 *top,ByteData256 *args)

{
  ByteData result;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  Concat<cfd::core::ByteData160>((ByteData *)&local_30,this,top);
  Concat<cfd::core::ByteData256>(__return_storage_ptr__,(ByteData *)&local_30,args);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  return __return_storage_ptr__;
}

Assistant:

ByteData Concat(const ByteTop& top, const ByteDataClass&... args) const {
    ByteData result = Concat(top);
    return result.Concat(args...);
  }